

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O3

void __thiscall
de::cmdline::detail::TypedFieldMap::set(TypedFieldMap *this,type_info *key,Entry *value)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  pair<const_std::type_info_*,_de::cmdline::detail::TypedFieldMap::Entry> local_28;
  
  p_Var2 = (this->m_fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var1 = &(this->m_fields)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      if (*(type_info **)(p_Var2 + 1) >= key) {
        p_Var3 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[*(type_info **)(p_Var2 + 1) < key];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var3 != p_Var1) && (*(type_info **)(p_Var3 + 1) <= key)) {
      (*(code *)p_Var3[1]._M_left)(p_Var3[1]._M_parent);
      p_Var3[1]._M_parent = (_Base_ptr)0x0;
      p_Var2 = (_Base_ptr)value->destructor;
      p_Var3[1]._M_parent = (_Base_ptr)value->value;
      p_Var3[1]._M_left = p_Var2;
      return;
    }
  }
  local_28.second.value = value->value;
  local_28.second.destructor = value->destructor;
  local_28.first = key;
  std::
  _Rb_tree<std::type_info_const*,std::pair<std::type_info_const*const,de::cmdline::detail::TypedFieldMap::Entry>,std::_Select1st<std::pair<std::type_info_const*const,de::cmdline::detail::TypedFieldMap::Entry>>,std::less<std::type_info_const*>,std::allocator<std::pair<std::type_info_const*const,de::cmdline::detail::TypedFieldMap::Entry>>>
  ::_M_emplace_unique<std::pair<std::type_info_const*,de::cmdline::detail::TypedFieldMap::Entry>>
            ((_Rb_tree<std::type_info_const*,std::pair<std::type_info_const*const,de::cmdline::detail::TypedFieldMap::Entry>,std::_Select1st<std::pair<std::type_info_const*const,de::cmdline::detail::TypedFieldMap::Entry>>,std::less<std::type_info_const*>,std::allocator<std::pair<std::type_info_const*const,de::cmdline::detail::TypedFieldMap::Entry>>>
              *)this,&local_28);
  return;
}

Assistant:

void TypedFieldMap::set (const std::type_info* key, const Entry& value)
{
	Map::iterator pos = m_fields.find(key);

	if (pos != m_fields.end())
	{
		pos->second.destructor(pos->second.value);
		pos->second.value = DE_NULL;

		pos->second = value;
	}
	else
		m_fields.insert(std::make_pair(key, value));
}